

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibPrepareAdd(Sfm_Lib_t *p,word *pTruth,int *Perm,int nFanins,Mio_Cell2_t *pCellBot,
                      Mio_Cell2_t *pCellTop,int InTop)

{
  uint uVar1;
  int *piVar2;
  word wVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  Sfm_Fun_t *pSVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  char cVar14;
  long lVar15;
  Sfm_Fun_t *pSVar16;
  int Profile [8];
  int InvPerm [8];
  int local_78 [8];
  char acStack_58 [40];
  
  if (pCellTop == (Mio_Cell2_t *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = (int)pCellTop->Area;
  }
  wVar3 = pCellBot->Area;
  uVar4 = Vec_MemHashInsert(p->vTtMem,pTruth);
  if (uVar4 == (p->vLists).nSize) {
    Vec_IntPush(&p->vLists,-1);
    Vec_IntPush(&p->vCounts,0);
    Vec_IntPush(&p->vHits,0);
  }
  iVar11 = iVar11 + (int)wVar3;
  if (p->fDelay == 0) {
    if (((int)uVar4 < 0) || ((p->vLists).nSize <= (int)uVar4)) goto LAB_004bfcad;
    lVar6 = (long)(p->vLists).pArray[uVar4];
    if ((lVar6 != -1) && (p->pObjs != (Sfm_Fun_t *)0x0)) {
      pSVar7 = p->pObjs + lVar6;
      do {
        if (pSVar7->Area <= iVar11) {
          return;
        }
      } while (((long)pSVar7->Next != -1) &&
              (pSVar7 = p->pObjs + pSVar7->Next, p->pObjs != (Sfm_Fun_t *)0x0));
    }
  }
  else {
    if ((p->vProfs).nSize != p->nObjs) {
      __assert_fail("Vec_IntSize(&p->vProfs) == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x152,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    Sfm_LibCellProfile(pCellBot,pCellTop,InTop,nFanins,Perm,local_78);
    (p->vTemp).nSize = 0;
    if (((int)uVar4 < 0) || ((p->vLists).nSize <= (int)uVar4)) goto LAB_004bfcad;
    lVar6 = (long)(p->vLists).pArray[uVar4];
    if ((lVar6 != -1) && (p->pObjs != (Sfm_Fun_t *)0x0)) {
      pSVar16 = p->pObjs + lVar6;
      pSVar7 = p->pObjs;
      do {
        Vec_IntPush(&p->vTemp,(int)((ulong)((long)pSVar16 - (long)pSVar7) >> 2) * -0x49249249);
        pSVar7 = p->pObjs;
        uVar8 = (int)((long)pSVar16 - (long)pSVar7 >> 2) * -0x49249249;
        if (((int)uVar8 < 0) || ((p->vProfs).nSize <= (int)uVar8)) goto LAB_004bfcad;
        uVar8 = (p->vProfs).pArray[uVar8 & 0x7fffffff];
        if (((int)uVar8 < 0) || ((p->vStore).nSize <= (int)uVar8)) goto LAB_004bfccc;
        if (pSVar16->Area <= iVar11) {
          if (nFanins < 1) {
LAB_004bf8d5:
            p->nObjSkipped = p->nObjSkipped + 1;
            return;
          }
          uVar9 = 0;
          while ((p->vStore).pArray[uVar8 + uVar9] <= local_78[uVar9]) {
            uVar9 = uVar9 + 1;
            if ((uint)nFanins == uVar9) goto LAB_004bf8d5;
          }
        }
      } while (((long)pSVar16->Next != -1) &&
              (pSVar16 = pSVar7 + pSVar16->Next, pSVar7 != (Sfm_Fun_t *)0x0));
      iVar10 = (p->vTemp).nSize;
      if (0 < iVar10) {
        piVar2 = (p->vTemp).pArray;
        lVar6 = 0;
        uVar8 = 0;
        do {
          iVar12 = piVar2[lVar6];
          lVar15 = (long)iVar12;
          if ((lVar15 < 0) || ((p->vProfs).nSize <= iVar12)) goto LAB_004bfcad;
          uVar1 = (p->vProfs).pArray[lVar15];
          if (((int)uVar1 < 0) || ((p->vStore).nSize <= (int)uVar1)) {
LAB_004bfccc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if (p->pObjs[lVar15].Area < iVar11) {
LAB_004bfb8e:
            if (((int)uVar8 < 0) || (iVar10 <= (int)uVar8)) goto LAB_004bfd86;
            uVar9 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            piVar2[uVar9] = iVar12;
            iVar10 = (p->vTemp).nSize;
          }
          else {
            if (0 < nFanins) {
              uVar9 = 0;
              do {
                if ((p->vStore).pArray[uVar1 + uVar9] < local_78[uVar9]) goto LAB_004bfb8e;
                uVar9 = uVar9 + 1;
              } while ((uint)nFanins != uVar9);
            }
            p->nObjRemoved = p->nObjRemoved + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar10);
        if ((int)uVar8 < (int)lVar6) {
          if (uVar8 == 0) {
            if ((p->vLists).nSize <= (int)uVar4) {
LAB_004bfd86:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pSVar7 = (Sfm_Fun_t *)((p->vLists).pArray + uVar4);
          }
          else {
            if (iVar10 < (int)uVar8) {
              __assert_fail("p->nSize >= nSizeNew",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
            }
            (p->vTemp).nSize = uVar8;
            if ((int)uVar8 < 1) goto LAB_004bfcad;
            if ((p->vLists).nSize <= (int)uVar4) goto LAB_004bfd86;
            piVar2 = (p->vTemp).pArray;
            iVar10 = *piVar2;
            (p->vLists).pArray[uVar4] = iVar10;
            lVar6 = (long)(p->vTemp).nSize;
            pSVar7 = p->pObjs;
            if (1 < lVar6) {
              lVar15 = 1;
              iVar12 = iVar10;
              do {
                iVar10 = piVar2[lVar15];
                pSVar7[iVar12].Next = iVar10;
                lVar15 = lVar15 + 1;
                iVar12 = iVar10;
              } while (lVar6 != lVar15);
            }
            pSVar7 = pSVar7 + iVar10;
          }
          pSVar7->Next = -1;
        }
      }
    }
  }
  if (0 < nFanins) {
    uVar9 = 0;
    do {
      *(int *)(acStack_58 + (long)Perm[uVar9] * 4) = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while ((uint)nFanins != uVar9);
  }
  if ((p->fDelay != 0) && (Vec_IntPush(&p->vProfs,(p->vStore).nSize), 0 < nFanins)) {
    uVar9 = 0;
    do {
      Vec_IntPush(&p->vStore,local_78[uVar9]);
      uVar9 = uVar9 + 1;
    } while ((uint)nFanins != uVar9);
  }
  iVar10 = p->nObjs;
  if (iVar10 == p->nObjsAlloc) {
    iVar12 = iVar10 * 2;
    if (p->pObjs == (Sfm_Fun_t *)0x0) {
      pSVar7 = (Sfm_Fun_t *)malloc((long)iVar10 * 0x38);
      iVar5 = iVar10;
    }
    else {
      pSVar7 = (Sfm_Fun_t *)realloc(p->pObjs,(long)iVar10 * 0x38);
      iVar10 = p->nObjs;
      iVar5 = p->nObjsAlloc;
    }
    p->pObjs = pSVar7;
    memset(pSVar7 + iVar5,0,(long)iVar5 * 0x1c);
    p->nObjsAlloc = iVar12;
  }
  else {
    pSVar7 = p->pObjs;
  }
  pSVar7[iVar10].Area = iVar11;
  if ((-1 < (int)uVar4) && ((int)uVar4 < (p->vLists).nSize)) {
    pSVar16 = pSVar7 + iVar10;
    piVar2 = (p->vLists).pArray;
    pSVar16->Next = piVar2[uVar4];
    p->nObjs = iVar10 + 1;
    piVar2[uVar4] = iVar10;
    if ((p->vCounts).nSize <= (int)uVar4) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
    piVar2 = (p->vCounts).pArray + uVar4;
    *piVar2 = *piVar2 + 1;
    if ((*(uint *)&pCellBot->field_0x10 & 0x3ffff80) != 0) {
      __assert_fail("pCellBot->Id < 128",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x19d,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    pSVar16->pFansB[0] = (char)*(uint *)&pCellBot->field_0x10;
    uVar9 = 0;
    if (0xfffffff < *(uint *)&pCellBot->field_0x10) {
      uVar9 = 0;
      do {
        pSVar7[iVar10].pFansB[uVar9 + 1] = acStack_58[uVar9 * 4];
        uVar9 = uVar9 + 1;
      } while (uVar9 < *(uint *)&pCellBot->field_0x10 >> 0x1c);
    }
    iVar11 = (int)uVar9;
    if (pCellTop != (Mio_Cell2_t *)0x0) {
      if ((*(uint *)&pCellTop->field_0x10 & 0x3ffff80) != 0) {
        __assert_fail("pCellTop->Id < 128",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                      ,0x1a3,
                      "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                     );
      }
      pSVar16->pFansT[0] = (char)*(uint *)&pCellTop->field_0x10;
      if (0xfffffff < *(uint *)&pCellTop->field_0x10) {
        uVar13 = 0;
        do {
          cVar14 = '\x10';
          if ((uint)InTop != uVar13) {
            iVar11 = (int)uVar9;
            uVar9 = (ulong)(iVar11 + 1);
            cVar14 = acStack_58[(long)iVar11 * 4];
          }
          iVar11 = (int)uVar9;
          pSVar7[iVar10].pFansT[uVar13 + 1] = cVar14;
          uVar13 = uVar13 + 1;
        } while (uVar13 < *(uint *)&pCellTop->field_0x10 >> 0x1c);
      }
      if (iVar11 != nFanins) {
        __assert_fail("k == nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                      ,0x1a7,
                      "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                     );
      }
    }
    return;
  }
LAB_004bfcad:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sfm_LibPrepareAdd( Sfm_Lib_t * p, word * pTruth, int * Perm, int nFanins, Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop )
{
    Sfm_Fun_t * pObj;
    int InvPerm[SFM_SUPP_MAX], Profile[SFM_SUPP_MAX];
    int Area = (int)pCellBot->Area + (pCellTop ? (int)pCellTop->Area : 0);
    int i, k, Id, Prev, Offset, * pProf, iFunc = Vec_MemHashInsert( p->vTtMem, pTruth );
    if ( iFunc == Vec_IntSize(&p->vLists) )
    {
        Vec_IntPush( &p->vLists, -1 );
        Vec_IntPush( &p->vCounts, 0 );
        Vec_IntPush( &p->vHits,   0 );
    }
    assert( pCellBot != NULL );
    // iterate through the supergates of this truth table
    if ( p->fDelay )
    {
        assert( Vec_IntSize(&p->vProfs) == p->nObjs );
        Sfm_LibCellProfile( pCellBot, pCellTop, InTop, nFanins, Perm, Profile );
        // check if new one is contained in old ones
        Vec_IntClear( &p->vTemp );
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            Vec_IntPush( &p->vTemp, Sfm_LibFunId(p, pObj) );
            Offset = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( Sfm_LibNewIsContained(pObj, pProf, Area, Profile, nFanins) )
            {
                p->nObjSkipped++;
                return;
            }
        }
        // check if old ones are contained in new one
        k = 0;
        Vec_IntForEachEntry( &p->vTemp, Id, i )
        {
            Offset = Vec_IntEntry( &p->vProfs, Id );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( !Sfm_LibNewContains(Sfm_LibFun(p, Id), pProf, Area, Profile, nFanins) )
                Vec_IntWriteEntry( &p->vTemp, k++, Id );
            else
                p->nObjRemoved++;
        }
        if ( k < i ) // change
        {
            if ( k == 0 )
                Vec_IntWriteEntry( &p->vLists, iFunc, -1 );
            else
            {
                Vec_IntShrink( &p->vTemp, k );
                Prev = Vec_IntEntry(&p->vTemp, 0);
                Vec_IntWriteEntry( &p->vLists, iFunc, Prev );
                Vec_IntForEachEntryStart( &p->vTemp, Id, i, 1 )
                {
                    Sfm_LibFun(p, Prev)->Next = Id;
                    Prev = Id;
                }
                Sfm_LibFun(p, Prev)->Next = -1;
            }
        }
    }
    else
    {
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            if ( Area >= pObj->Area )
                return;
        }
    }
    for ( k = 0; k < nFanins; k++ )
        InvPerm[Perm[k]] = k;
    // create delay profile
    if ( p->fDelay )
    {
        Vec_IntPush( &p->vProfs, Vec_IntSize(&p->vStore) );
        for ( k = 0; k < nFanins; k++ )
            Vec_IntPush( &p->vStore, Profile[k] );
    }
    // create new object
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjsAlloc = 2 * p->nObjsAlloc;
        p->pObjs = ABC_REALLOC( Sfm_Fun_t, p->pObjs, nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Sfm_Fun_t) * p->nObjsAlloc );
        p->nObjsAlloc = nObjsAlloc;
    }
    pObj = p->pObjs + p->nObjs;
    pObj->Area = Area;
    pObj->Next = Vec_IntEntry(&p->vLists, iFunc);
    Vec_IntWriteEntry( &p->vLists, iFunc, p->nObjs++ );
    Vec_IntAddToEntry( &p->vCounts, iFunc, 1 );
    // create gate
    assert( pCellBot->Id < 128 );
    pObj->pFansB[0] = (char)pCellBot->Id;
    for ( k = 0; k < (int)pCellBot->nFanins; k++ )
        pObj->pFansB[k+1] = InvPerm[k];
    if ( pCellTop == NULL )
        return;
    assert( pCellTop->Id < 128 );
    pObj->pFansT[0] = (char)pCellTop->Id;
    for ( i = 0; i < (int)pCellTop->nFanins; i++ )
        pObj->pFansT[i+1] = (char)(i == InTop ? 16 : InvPerm[k++]);
    assert( k == nFanins );
}